

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O2

void __thiscall
Assimp::OptimizeGraphProcess::CollectNewChildren
          (OptimizeGraphProcess *this,aiNode *nd,list<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  LockedSetType *this_00;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  aiNode *paVar3;
  aiMesh *this_01;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  bool bVar22;
  int iVar23;
  aiNode **tmp;
  iterator iVar24;
  iterator iVar25;
  _List_node_base *p_Var26;
  iterator iVar27;
  aiMatrix3x3t<float> *paVar28;
  aiNode **ppaVar29;
  _Base_ptr p_Var30;
  value_type paVar31;
  uint i;
  ulong uVar32;
  int iVar33;
  OptimizeGraphProcess *pOVar34;
  long lVar35;
  iterator it;
  _List_node_base *p_Var36;
  list<aiNode_*,_std::allocator<aiNode_*>_> child_nodes;
  aiMatrix4x4 inv;
  list<aiNode_*,_std::allocator<aiNode_*>_> join;
  aiMatrix4x4t<float> temp;
  aiNode *child;
  aiNode *local_158;
  allocator local_149;
  OptimizeGraphProcess *local_148;
  _List_node_base *local_140;
  _List_base<aiNode_*,_std::allocator<aiNode_*>_> local_138;
  value_type local_120;
  _Base_ptr local_118;
  int local_10c;
  undefined1 local_108 [32];
  undefined8 uStack_e8;
  float local_e0;
  float local_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float local_cc;
  _List_base<aiNode_*,_std::allocator<aiNode_*>_> local_c0;
  aiMatrix4x4t<float> local_a8;
  _List_node_base *local_60;
  aiMatrix3x3t<float> local_58;
  
  this->nodes_in = this->nodes_in + nd->mNumChildren;
  local_138._M_impl._M_node._M_size = 0;
  local_158 = nd;
  local_140 = (_List_node_base *)nodes;
  local_138._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_138;
  local_138._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_138;
  for (uVar32 = 0; uVar32 < local_158->mNumChildren; uVar32 = uVar32 + 1) {
    CollectNewChildren(this,local_158->mChildren[uVar32],
                       (list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_138);
    local_158->mChildren[uVar32] = (aiNode *)0x0;
  }
  std::__cxx11::string::string((string *)local_108,(local_158->mName).data,(allocator *)&local_a8);
  this_00 = &this->locked;
  iVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_108);
  p_Var1 = &(this->locked)._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)local_108);
  local_148 = this;
  local_118 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)iVar24._M_node == p_Var1) {
    iVar25._M_node = local_138._M_impl._M_node.super__List_node_base._M_next;
    while (paVar3 = local_158, iVar25._M_node != (_List_node_base *)&local_138) {
      std::__cxx11::string::string
                ((string *)local_108,(char *)((long)&(iVar25._M_node[1]._M_next)->_M_next + 4),
                 (allocator *)&local_a8);
      iVar27 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&this_00->_M_t,(key_type *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      if (iVar27._M_node == iVar24._M_node) {
        p_Var26 = iVar25._M_node + 1;
        uVar9 = (local_158->mTransformation).a1;
        uVar10 = (local_158->mTransformation).a2;
        uVar11 = (local_158->mTransformation).a3;
        uVar12 = (local_158->mTransformation).a4;
        uVar13 = (local_158->mTransformation).b1;
        uVar14 = (local_158->mTransformation).b2;
        local_108._24_4_ = (local_158->mTransformation).b3;
        local_108._28_4_ = (local_158->mTransformation).b4;
        uStack_e8._0_4_ = (local_158->mTransformation).c1;
        uStack_e8._4_4_ = (local_158->mTransformation).c2;
        uVar15 = (local_158->mTransformation).c3;
        uVar16 = (local_158->mTransformation).c4;
        uVar17 = (local_158->mTransformation).d1;
        uVar18 = (local_158->mTransformation).d2;
        uVar19 = (local_158->mTransformation).d3;
        uVar20 = (local_158->mTransformation).d4;
        local_108._0_4_ = uVar9;
        local_108._4_4_ = uVar10;
        local_108._8_4_ = uVar11;
        local_108._12_4_ = uVar12;
        local_108._16_4_ = uVar13;
        local_108._20_4_ = uVar14;
        local_e0 = (float)uVar15;
        local_dc = (float)uVar16;
        fStack_d8 = (float)uVar17;
        fStack_d4 = (float)uVar18;
        fStack_d0 = (float)uVar19;
        local_cc = (float)uVar20;
        aiMatrix4x4t<float>::operator*=
                  ((aiMatrix4x4t<float> *)local_108,&((value_type)p_Var26->_M_next)->mTransformation
                  );
        paVar31 = (value_type)p_Var26->_M_next;
        (paVar31->mTransformation).d1 = fStack_d8;
        (paVar31->mTransformation).d2 = fStack_d4;
        (paVar31->mTransformation).d3 = fStack_d0;
        (paVar31->mTransformation).d4 = local_cc;
        (paVar31->mTransformation).c1 = (float)uStack_e8;
        (paVar31->mTransformation).c2 = uStack_e8._4_4_;
        (paVar31->mTransformation).c3 = local_e0;
        (paVar31->mTransformation).c4 = local_dc;
        (paVar31->mTransformation).b1 = (float)local_108._16_4_;
        (paVar31->mTransformation).b2 = (float)local_108._20_4_;
        (paVar31->mTransformation).b3 = (float)local_108._24_4_;
        (paVar31->mTransformation).b4 = (float)local_108._28_4_;
        (paVar31->mTransformation).a1 = (float)local_108._0_4_;
        (paVar31->mTransformation).a2 = (float)local_108._4_4_;
        (paVar31->mTransformation).a3 = (float)local_108._8_4_;
        (paVar31->mTransformation).a4 = (float)local_108._12_4_;
        std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_140,(value_type *)p_Var26);
        iVar25 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::erase
                           ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_138,iVar25._M_node);
      }
      else {
        iVar25._M_node = (iVar25._M_node)->_M_next;
      }
    }
    if ((local_158->mNumMeshes == 0) &&
       (local_138._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_138)) {
      aiNode::~aiNode(local_158);
      operator_delete(paVar3);
      goto LAB_003c4d02;
    }
    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_140,&local_158);
    pOVar34 = local_148;
  }
  else {
    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_140,&local_158);
    local_108._0_4_ = 1.0;
    local_108._4_4_ = 0.0;
    local_108._8_4_ = 0.0;
    local_108._12_4_ = 0.0;
    local_108._16_4_ = 0.0;
    local_108._20_4_ = 1.0;
    local_108._24_4_ = 0.0;
    local_108._28_4_ = 0.0;
    uStack_e8._0_4_ = 0.0;
    uStack_e8._4_4_ = 0.0;
    local_e0 = 1.0;
    local_dc = 0.0;
    fStack_d8 = 0.0;
    fStack_d4 = 0.0;
    fStack_d0 = 0.0;
    local_cc = 1.0;
    local_c0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
    local_c0._M_impl._M_node._M_size = 0;
    paVar31 = (value_type)0x0;
    iVar25._M_node = local_138._M_impl._M_node.super__List_node_base._M_next;
    local_c0._M_impl._M_node.super__List_node_base._M_prev =
         local_c0._M_impl._M_node.super__List_node_base._M_next;
    while (pOVar34 = local_148, iVar25._M_node != (_List_node_base *)&local_138) {
      local_58._0_8_ = iVar25._M_node[1]._M_next;
      if (*(int *)&((_List_node_base *)&((value_type)local_58._0_8_)->mNumChildren)->_M_next == 0) {
        std::__cxx11::string::string
                  ((string *)&local_a8,(((value_type)local_58._0_8_)->mName).data,&local_149);
        iVar24 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&this_00->_M_t,(key_type *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        uVar21 = local_58._0_8_;
        if (iVar24._M_node != local_118) goto LAB_003c4741;
        uVar2 = *(uint *)&((_List_node_base *)(local_58._0_8_ + 0x460))->_M_next;
        for (uVar32 = 0; uVar2 != uVar32; uVar32 = uVar32 + 1) {
          if (1 < (local_148->meshes).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [*(uint *)((long)&((_List_node_base *)(local_58._0_8_ + 0x468))->_M_next->_M_next
                            + uVar32 * 4)]) {
            if (uVar2 != (uint)uVar32) goto LAB_003c4741;
            break;
          }
        }
        if (paVar31 == (value_type)0x0) {
          uVar4 = *(undefined8 *)&((aiMatrix4x4 *)(local_58._0_8_ + 0x404))->a3;
          uVar5 = *(undefined8 *)
                   ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_next + 4);
          local_108._24_8_ =
               *(undefined8 *)
                ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_prev + 4);
          uStack_e8 = *(undefined8 *)
                       ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_next + 4);
          uVar6 = *(undefined8 *)
                   ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_prev + 4);
          uVar7 = *(undefined8 *)
                   ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x2c))->_M_next + 4);
          uVar8 = *(undefined8 *)
                   ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x2c))->_M_prev + 4);
          fStack_d8 = (float)uVar7;
          fStack_d4 = (float)((ulong)uVar7 >> 0x20);
          fStack_d0 = (float)uVar8;
          local_cc = (float)((ulong)uVar8 >> 0x20);
          local_e0 = (float)uVar6;
          local_dc = (float)((ulong)uVar6 >> 0x20);
          local_108._16_4_ = (undefined4)uVar5;
          local_108._20_4_ = (undefined4)((ulong)uVar5 >> 0x20);
          local_108._0_4_ = (undefined4)*(undefined8 *)(local_58._0_8_ + 0x404);
          local_108._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_58._0_8_ + 0x404) >> 0x20);
          local_108._8_4_ = (undefined4)uVar4;
          local_108._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_108);
          paVar31 = (value_type)uVar21;
          goto LAB_003c4741;
        }
        local_a8.a2 = (float)local_108._4_4_;
        local_a8.a1 = (float)local_108._0_4_;
        local_a8.a4 = (float)local_108._12_4_;
        local_a8.a3 = (float)local_108._8_4_;
        local_a8.b2 = (float)local_108._20_4_;
        local_a8.b1 = (float)local_108._16_4_;
        local_a8.c4 = local_dc;
        local_a8.c3 = local_e0;
        local_a8.d2 = fStack_d4;
        local_a8.d1 = fStack_d8;
        local_a8.d4 = local_cc;
        local_a8.d3 = fStack_d0;
        local_a8.c1 = (float)uStack_e8;
        local_a8.c2 = uStack_e8._4_4_;
        local_a8.b3 = (float)local_108._24_4_;
        local_a8.b4 = (float)local_108._28_4_;
        aiMatrix4x4t<float>::operator*=(&local_a8,(aiMatrix4x4t<float> *)(local_58._0_8_ + 0x404));
        *(undefined8 *)((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x2c))->_M_next + 4) =
             local_a8._48_8_;
        *(undefined8 *)((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x2c))->_M_prev + 4) =
             local_a8._56_8_;
        *(undefined8 *)((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_next + 4) =
             local_a8._32_8_;
        *(undefined8 *)((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_prev + 4) =
             local_a8._40_8_;
        *(undefined8 *)((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_next + 4) =
             local_a8._16_8_;
        *(undefined8 *)((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_prev + 4) =
             local_a8._24_8_;
        *(undefined8 *)(local_58._0_8_ + 0x404) = local_a8._0_8_;
        *(undefined8 *)&((aiMatrix4x4 *)(local_58._0_8_ + 0x404))->a3 = local_a8._8_8_;
        std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_c0,(value_type *)&local_58);
        iVar25 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::erase
                           ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_138,iVar25._M_node);
      }
      else {
LAB_003c4741:
        iVar25._M_node = (iVar25._M_node)->_M_next;
      }
    }
    if ((paVar31 != (value_type)0x0) &&
       (local_c0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_c0)) {
      local_148->count_merged = local_148->count_merged + 1;
      iVar33 = 0;
      local_120 = paVar31;
      iVar23 = snprintf((paVar31->mName).data,0x400,"$MergedNode_%i");
      p_Var36 = local_c0._M_impl._M_node.super__List_node_base._M_next;
      (local_120->mName).length = iVar23;
      for (p_Var26 = local_c0._M_impl._M_node.super__List_node_base._M_next;
          p_Var26 != (_List_node_base *)&local_c0;
          p_Var26 = (((_List_impl *)&p_Var26->_M_next)->_M_node).super__List_node_base._M_next) {
        iVar33 = iVar33 + *(int *)(*(size_t *)(p_Var26 + 1) + 0x460);
      }
      if (iVar33 != 0) {
        local_60 = (_List_node_base *)
                   operator_new__((ulong)(uint)(*(int *)&((_List_node_base *)&local_120->mNumMeshes)
                                                         ->_M_next + iVar33) << 2);
        p_Var26 = local_60;
        for (uVar32 = 0; uVar32 < *(uint *)&((_List_node_base *)&local_120->mNumMeshes)->_M_next;
            uVar32 = uVar32 + 1) {
          *(undefined4 *)&p_Var26->_M_next =
               *(undefined4 *)
                ((long)&((_List_node_base *)&local_120->mMeshes)->_M_next->_M_next + uVar32 * 4);
          p_Var26 = (_List_node_base *)((long)&p_Var26->_M_next + 4);
        }
        local_10c = iVar33;
        for (; p_Var36 != (_List_node_base *)&local_c0; p_Var36 = p_Var36->_M_next) {
          p_Var30 = (_Base_ptr)0x0;
          while (paVar3 = (aiNode *)p_Var36[1]._M_next,
                p_Var30 < (_Base_ptr)(ulong)paVar3->mNumMeshes) {
            uVar2 = paVar3->mMeshes[(long)p_Var30];
            *(uint *)&p_Var26->_M_next = uVar2;
            this_01 = local_148->mScene->mMeshes[uVar2];
            local_118 = p_Var30;
            aiMatrix3x3t<float>::aiMatrix3x3t
                      (&local_58,
                       (aiMatrix4x4t<float> *)((long)&p_Var36[1]._M_next[0x40]._M_next + 4));
            paVar28 = aiMatrix3x3t<float>::Inverse(&local_58);
            local_140 = (_List_node_base *)((long)&p_Var26->_M_next + 4);
            paVar28 = aiMatrix3x3t<float>::Transpose(paVar28);
            local_a8.a1 = paVar28->a1;
            local_a8.a2 = paVar28->a2;
            local_a8.a3 = paVar28->a3;
            local_a8.a4 = paVar28->b1;
            local_a8.b1 = paVar28->b2;
            local_a8.b2 = paVar28->b3;
            local_a8.b3 = paVar28->c1;
            local_a8.b4 = paVar28->c2;
            local_a8.c1 = paVar28->c3;
            lVar35 = 0;
            for (uVar32 = 0; uVar32 < this_01->mNumVertices; uVar32 = uVar32 + 1) {
              aiVector3t<float>::operator*=
                        ((aiVector3t<float> *)((long)&this_01->mVertices->x + lVar35),
                         (aiMatrix4x4t<float> *)((long)&p_Var36[1]._M_next[0x40]._M_next + 4));
              if ((this_01->mNormals != (aiVector3D *)0x0) && (this_01->mNumVertices != 0)) {
                aiVector3t<float>::operator*=
                          ((aiVector3t<float> *)((long)&this_01->mNormals->x + lVar35),
                           (aiMatrix3x3t<float> *)&local_a8);
              }
              bVar22 = aiMesh::HasTangentsAndBitangents(this_01);
              if (bVar22) {
                aiVector3t<float>::operator*=
                          ((aiVector3t<float> *)((long)&this_01->mTangents->x + lVar35),
                           (aiMatrix3x3t<float> *)&local_a8);
                aiVector3t<float>::operator*=
                          ((aiVector3t<float> *)((long)&this_01->mBitangents->x + lVar35),
                           (aiMatrix3x3t<float> *)&local_a8);
              }
              lVar35 = lVar35 + 0xc;
            }
            p_Var26 = local_140;
            p_Var30 = (_Base_ptr)((long)&local_118->_M_color + 1);
          }
          aiNode::~aiNode(paVar3);
          operator_delete(paVar3);
        }
        p_Var26 = ((_List_node_base *)&local_120->mMeshes)->_M_next;
        if (p_Var26 != (_List_node_base *)0x0) {
          operator_delete__(p_Var26);
        }
        ((_List_node_base *)&local_120->mMeshes)->_M_next = local_60;
        *(int *)&((_List_node_base *)&local_120->mNumMeshes)->_M_next =
             *(int *)&((_List_node_base *)&local_120->mNumMeshes)->_M_next + local_10c;
        pOVar34 = local_148;
      }
    }
    std::__cxx11::_List_base<aiNode_*,_std::allocator<aiNode_*>_>::_M_clear(&local_c0);
  }
  if ((local_138._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_138) ||
     (local_158->mNumChildren < local_138._M_impl._M_node._M_size)) {
    if (local_158->mChildren != (aiNode **)0x0) {
      operator_delete__(local_158->mChildren);
    }
    p_Var26 = local_138._M_impl._M_node.super__List_node_base._M_next;
    uVar2 = (uint)local_138._M_impl._M_node._M_size;
    if (local_138._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_138) {
      ppaVar29 = (aiNode **)
                 operator_new__(-(ulong)(local_138._M_impl._M_node._M_size >> 0x3d != 0) |
                                local_138._M_impl._M_node._M_size * 8);
      local_158->mChildren = ppaVar29;
      local_158->mNumChildren = uVar2;
      goto LAB_003c4cdc;
    }
    local_158->mChildren = (aiNode **)0x0;
    local_158->mNumChildren = (uint)local_138._M_impl._M_node._M_size;
    uVar32 = local_138._M_impl._M_node._M_size & 0xffffffff;
  }
  else {
    ppaVar29 = local_158->mChildren;
    local_158->mNumChildren = (uint)local_138._M_impl._M_node._M_size;
    uVar32 = local_138._M_impl._M_node._M_size;
    p_Var26 = local_138._M_impl._M_node.super__List_node_base._M_next;
    if (ppaVar29 != (aiNode **)0x0) {
LAB_003c4cdc:
      for (; p_Var26 != (_List_node_base *)&local_138;
          p_Var26 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var26->_M_next)->_M_impl
                    )._M_node.super__List_node_base._M_next) {
        paVar3 = (aiNode *)p_Var26[1]._M_next;
        *ppaVar29 = paVar3;
        ppaVar29 = ppaVar29 + 1;
        paVar3->mParent = local_158;
      }
      uVar32 = local_138._M_impl._M_node._M_size & 0xffffffff;
    }
  }
  pOVar34->nodes_out = pOVar34->nodes_out + (int)uVar32;
LAB_003c4d02:
  std::__cxx11::_List_base<aiNode_*,_std::allocator<aiNode_*>_>::_M_clear(&local_138);
  return;
}

Assistant:

void OptimizeGraphProcess::CollectNewChildren(aiNode* nd, std::list<aiNode*>& nodes) {
    nodes_in += nd->mNumChildren;

    // Process children
    std::list<aiNode*> child_nodes;
    for (unsigned int i = 0; i < nd->mNumChildren; ++i) {
        CollectNewChildren(nd->mChildren[i],child_nodes);
        nd->mChildren[i] = nullptr;
    }

    // Check whether we need this node; if not we can replace it by our own children (warn, danger of incest).
    if (locked.find(AI_OG_GETKEY(nd->mName)) == locked.end() ) {
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end();) {

            if (locked.find(AI_OG_GETKEY((*it)->mName)) == locked.end()) {
                (*it)->mTransformation = nd->mTransformation * (*it)->mTransformation;
                nodes.push_back(*it);

                it = child_nodes.erase(it);
                continue;
            }
            ++it;
        }

        if (nd->mNumMeshes || !child_nodes.empty()) {
            nodes.push_back(nd);
        } else {
            delete nd; /* bye, node */
            return;
        }
    } else {

        // Retain our current position in the hierarchy
        nodes.push_back(nd);

        // Now check for possible optimizations in our list of child nodes. join as many as possible
        aiNode* join_master = NULL;
        aiMatrix4x4 inv;

        const LockedSetType::const_iterator end = locked.end();

        std::list<aiNode*> join;
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end();)   {
            aiNode* child = *it;
            if (child->mNumChildren == 0 && locked.find(AI_OG_GETKEY(child->mName)) == end) {

                // There may be no instanced meshes
                unsigned int n = 0;
                for (; n < child->mNumMeshes;++n) {
                    if (meshes[child->mMeshes[n]] > 1) {
                        break;
                    }
                }
                if (n == child->mNumMeshes) {
                    if (!join_master) {
                        join_master = child;
                        inv = join_master->mTransformation;
                        inv.Inverse();
                    } else {
                        child->mTransformation = inv * child->mTransformation ;

                        join.push_back(child);
                        it = child_nodes.erase(it);
                        continue;
                    }
                }
            }
            ++it;
        }
        if (join_master && !join.empty()) {
            join_master->mName.length = ::ai_snprintf(join_master->mName.data, MAXLEN, "$MergedNode_%i",count_merged++);

            unsigned int out_meshes = 0;
            for (std::list<aiNode*>::iterator it = join.begin(); it != join.end(); ++it) {
                out_meshes += (*it)->mNumMeshes;
            }

            // copy all mesh references in one array
            if (out_meshes) {
                unsigned int* meshes = new unsigned int[out_meshes+join_master->mNumMeshes], *tmp = meshes;
                for (unsigned int n = 0; n < join_master->mNumMeshes;++n) {
                    *tmp++ = join_master->mMeshes[n];
                }

                for (std::list<aiNode*>::iterator it = join.begin(); it != join.end(); ++it) {
                    for (unsigned int n = 0; n < (*it)->mNumMeshes; ++n) {

                        *tmp = (*it)->mMeshes[n];
                        aiMesh* mesh = mScene->mMeshes[*tmp++];

                        // manually move the mesh into the right coordinate system
                        const aiMatrix3x3 IT = aiMatrix3x3( (*it)->mTransformation ).Inverse().Transpose();
                        for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {

                            mesh->mVertices[a] *= (*it)->mTransformation;

                            if (mesh->HasNormals())
                                mesh->mNormals[a] *= IT;

                            if (mesh->HasTangentsAndBitangents()) {
                                mesh->mTangents[a] *= IT;
                                mesh->mBitangents[a] *= IT;
                            }
                        }
                    }
                    delete *it; // bye, node
                }
                delete[] join_master->mMeshes;
                join_master->mMeshes = meshes;
                join_master->mNumMeshes += out_meshes;
            }
        }
    }
    // reassign children if something changed
    if (child_nodes.empty() || child_nodes.size() > nd->mNumChildren) {

        delete[] nd->mChildren;

        if (!child_nodes.empty()) {
            nd->mChildren = new aiNode*[child_nodes.size()];
        }
        else nd->mChildren = nullptr;
    }

    nd->mNumChildren = static_cast<unsigned int>(child_nodes.size());

    if (nd->mChildren) {
        aiNode** tmp = nd->mChildren;
        for (std::list<aiNode*>::iterator it = child_nodes.begin(); it != child_nodes.end(); ++it) {
            aiNode* node = *tmp++ = *it;
            node->mParent = nd;
        }
    }

    nodes_out += static_cast<unsigned int>(child_nodes.size());
}